

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall ON_ClassArray<ON_Texture>::Append(ON_ClassArray<ON_Texture> *this,ON_Texture *x)

{
  uint uVar1;
  ON_Texture *pOVar2;
  int iVar3;
  uint uVar4;
  ON_Texture temp;
  ON_Texture local_220;
  
  uVar1 = this->m_count;
  if (uVar1 == this->m_capacity) {
    if ((int)uVar1 < 8 || (ulong)((long)(int)uVar1 << 9) < 0x10000001) {
      uVar4 = 4;
      if (2 < (int)uVar1) {
        uVar4 = uVar1 * 2;
      }
    }
    else {
      uVar4 = 0x80008;
      if (uVar1 < 0x80008) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 + uVar1;
    }
    pOVar2 = this->m_a;
    if ((pOVar2 != (ON_Texture *)0x0) &&
       (iVar3 = (int)((ulong)((long)x - (long)pOVar2) >> 9), iVar3 < (int)uVar1 && -1 < iVar3)) {
      ON_Texture::ON_Texture(&local_220);
      ON_Texture::operator=(&local_220,x);
      if ((uint)this->m_capacity < uVar4) {
        SetCapacity(this,(long)(int)uVar4);
      }
      if (this->m_a == (ON_Texture *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                   ,0x6bc,"","allocation failure");
      }
      else {
        iVar3 = this->m_count;
        this->m_count = iVar3 + 1;
        ON_Texture::operator=(this->m_a + iVar3,&local_220);
      }
      ON_Texture::~ON_Texture(&local_220);
      return;
    }
    if (uVar1 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
      pOVar2 = this->m_a;
    }
    if (pOVar2 == (ON_Texture *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x6c6,"","allocation failure");
      return;
    }
    uVar1 = this->m_count;
  }
  else {
    pOVar2 = this->m_a;
  }
  this->m_count = uVar1 + 1;
  ON_Texture::operator=(pOVar2 + (int)uVar1,x);
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}